

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

void duckdb::ReservoirQuantileOperation::
     Combine<duckdb::ReservoirQuantileState<int>,duckdb::ReservoirQuantileListOperation<int>>
               (ReservoirQuantileState<int> *source,ReservoirQuantileState<int> *target,
               AggregateInputData *param_3)

{
  BaseReservoirSampling *this;
  long in_RSI;
  long in_RDI;
  idx_t src_idx;
  idx_t in_stack_00000018;
  ulong uVar1;
  idx_t in_stack_ffffffffffffffd8;
  ReservoirQuantileState<int> *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    if (*(long *)(in_RSI + 0x10) == 0) {
      ReservoirQuantileState<int>::Resize((ReservoirQuantileState<int> *)param_3,in_stack_00000018);
    }
    if (*(long *)(in_RSI + 0x18) == 0) {
      this = (BaseReservoirSampling *)operator_new(0x78);
      duckdb::BaseReservoirSampling::BaseReservoirSampling(this);
      *(BaseReservoirSampling **)(in_RSI + 0x18) = this;
    }
    for (uVar1 = 0; uVar1 < *(ulong *)(in_RDI + 0x10); uVar1 = uVar1 + 1) {
      ReservoirQuantileState<int>::FillReservoir
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(int)(uVar1 >> 0x20));
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (source.pos == 0) {
			return;
		}
		if (target.pos == 0) {
			target.Resize(source.len);
		}
		if (!target.r_samp) {
			target.r_samp = new BaseReservoirSampling();
		}
		for (idx_t src_idx = 0; src_idx < source.pos; src_idx++) {
			target.FillReservoir(target.len, source.v[src_idx]);
		}
	}